

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_test.cpp
# Opt level: O0

void test_parse(void)

{
  bool bVar1;
  istream *piVar2;
  type pjVar3;
  type other;
  ostream *poVar4;
  exception *e;
  string local_300 [32];
  undefined1 local_2e0 [8];
  unique_ptr<argo::json,_std::default_delete<argo::json>_> j1;
  string local_2d0 [32];
  string local_2b0 [32];
  undefined1 local_290 [8];
  unique_ptr<argo::json,_std::default_delete<argo::json>_> j;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> valid;
  string local_268 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> file_name;
  size_type x;
  string local_230 [8];
  string line;
  istream local_210 [8];
  ifstream f;
  
  std::ifstream::ifstream(local_210,"test_files/general/tests.txt",8);
  std::__cxx11::string::string(local_230);
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_210,local_230);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    std::__cxx11::string::find_first_of((char *)local_230,0x13a522);
    std::__cxx11::string::substr((ulong)local_268,(ulong)local_230);
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)&j,(ulong)local_230);
    std::operator+((char *)local_2b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "test_files/general/");
    argo::parser::load((parser *)local_290,local_2b0);
    std::__cxx11::string::~string((string *)local_2b0);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&j,
                            "valid");
    if (bVar1) {
      pjVar3 = std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::operator*
                         ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)local_290);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2d0,"test_files/tmp.json",
                 (allocator *)
                 ((long)&j1._M_t.super___uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
                         super__Head_base<0UL,_argo::json_*,_false>._M_head_impl + 7));
      argo::unparser::save(pjVar3,(string *)local_2d0," ",""," ",0);
      std::__cxx11::string::~string(local_2d0);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&j1._M_t.super___uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
                         super__Head_base<0UL,_argo::json_*,_false>._M_head_impl + 7));
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_300,"test_files/tmp.json",(allocator *)((long)&e + 7));
      argo::parser::load((parser *)local_2e0,(string *)local_300);
      std::__cxx11::string::~string(local_300);
      std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
      pjVar3 = std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::operator*
                         ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)local_2e0);
      other = std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::operator*
                        ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)local_290);
      bVar1 = argo::json::operator==(pjVar3,other);
      if (bVar1) {
        poVar4 = std::operator<<((ostream *)jlog,"PASS: parse test passed, valid file ");
        poVar4 = std::operator<<(poVar4,local_268);
        std::operator<<(poVar4," was read, written, reread and compared\n");
      }
      else {
        poVar4 = std::operator<<((ostream *)jlog,"FAIL: parse test failed, valid file ");
        poVar4 = std::operator<<(poVar4,local_268);
        std::operator<<(poVar4," was read, written, reread and came out different\n");
      }
      std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr
                ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)local_2e0);
    }
    else {
      poVar4 = std::operator<<((ostream *)jlog,"FAIL: parse test failed, invalid file ");
      poVar4 = std::operator<<(poVar4,local_268);
      std::operator<<(poVar4," didn\'t cause an exception\n");
    }
    std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr
              ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)local_290);
    std::__cxx11::string::~string((string *)&j);
    std::__cxx11::string::~string(local_268);
  }
  std::__cxx11::string::~string(local_230);
  std::ifstream::~ifstream(local_210);
  return;
}

Assistant:

void test_parse()
{
    ifstream f("test_files/general/tests.txt");

    string line;

    while (getline(f, line))
    {
        auto x = line.find_first_of(" ");
        auto file_name = line.substr(0, x);
        auto valid = line.substr(x + 1, line.size() - x -1);

        try
        {
            auto j = parser::load("test_files/general/" + file_name);
            if (valid == "valid")
            {
                unparser::save(*j, "test_files/tmp.json");
                auto j1 = parser::load("test_files/tmp.json");
                if (*j1 == *j)
                {
                    jlog << "PASS: parse test passed, valid file " << file_name << " was read, written, reread and compared\n";
                }
                else
                {
                    jlog << "FAIL: parse test failed, valid file " << file_name << " was read, written, reread and came out different\n";
                }
            }
            else
            {
                jlog << "FAIL: parse test failed, invalid file " << file_name << " didn't cause an exception\n";
            }
        }
        catch (exception &e)
        {
            if (valid == "valid")
            {
                jlog << "FAIL: parse test failed, valid file " << file_name << " caused an exception\n";
                jlog << e.what() << endl;
            }
            else
            {
                jlog << "PASS: parse test passed, invalid file " << file_name << " caused an exception:" << e.what() << endl;
            }
        }
    }
}